

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::
GenerateDynamicMethodMergeFromStream(ImmutableMessageLiteGenerator *this,Printer *printer)

{
  int iVar1;
  Descriptor *pDVar2;
  FieldDescriptor *this_00;
  ImmutableMessageLiteGenerator *pIVar3;
  bool bVar4;
  Type TVar5;
  FieldDescriptor **ppFVar6;
  ImmutableFieldLiteGenerator *pIVar7;
  int i;
  int i_00;
  char *text;
  long i_01;
  scoped_array<const_google::protobuf::FieldDescriptor_*> sorted_fields;
  scoped_array<const_google::protobuf::FieldDescriptor_*> local_60;
  ImmutableMessageLiteGenerator *local_58;
  string local_50;
  
  io::Printer::Print(printer,
                     "com.google.protobuf.CodedInputStream input =\n    (com.google.protobuf.CodedInputStream) arg0;\ncom.google.protobuf.ExtensionRegistryLite extensionRegistry =\n    (com.google.protobuf.ExtensionRegistryLite) arg1;\n"
                    );
  io::Printer::Print(printer,"try {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"boolean done = false;\nwhile (!done) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"int tag = input.readTag();\nswitch (tag) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"case 0:\n  done = true;\n  break;\n");
  pDVar2 = (this->super_MessageGenerator).descriptor_;
  if (*(int *)(*(long *)(pDVar2 + 0x10) + 0x8c) == 3) {
    text = "default: {\n  if (!input.skipField(tag)) {\n    done = true;\n  }\n  break;\n}\n";
  }
  else if (*(int *)(pDVar2 + 0x68) < 1) {
    text = 
    "default: {\n  if (!parseUnknownField(tag, input)) {\n    done = true;\n  }\n  break;\n}\n";
  }
  else {
    text = 
    "default: {\n  if (!parseUnknownField(getDefaultInstanceForType(),\n      input, extensionRegistry, tag)) {\n    done = true;\n  }\n  break;\n}\n"
    ;
    if (*(char *)(*(long *)(pDVar2 + 0x20) + 0x68) != '\0') {
      text = 
      "default: {\n  if (!parseUnknownFieldAsMessageSet(\n      getDefaultInstanceForType(), input, extensionRegistry,\n      tag)) {\n    done = true;\n  }\n  break;\n}\n"
      ;
    }
  }
  local_58 = this;
  io::Printer::Print(printer,text);
  pIVar3 = local_58;
  local_60.array_ = SortFieldsByNumber((local_58->super_MessageGenerator).descriptor_);
  for (i_01 = 0; i_01 < *(int *)((local_58->super_MessageGenerator).descriptor_ + 0x2c);
      i_01 = i_01 + 1) {
    ppFVar6 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                        (&local_60,i_01);
    this_00 = *ppFVar6;
    iVar1 = *(int *)(this_00 + 0x38);
    TVar5 = FieldDescriptor::type(this_00);
    SimpleItoa_abi_cxx11_
              (&local_50,
               (protobuf *)
               (ulong)(iVar1 << 3 |
                      *(uint *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)TVar5 * 4))
               ,i);
    io::Printer::Print(printer,"case $tag$: {\n","tag",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    io::Printer::Indent(printer);
    pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                       (&pIVar3->field_generators_,this_00);
    (*pIVar7->_vptr_ImmutableFieldLiteGenerator[10])(pIVar7,printer);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"  break;\n}\n");
    bVar4 = FieldDescriptor::is_packable(this_00);
    if (bVar4) {
      SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)(*(int *)(this_00 + 0x38) * 8 + 2),i_00);
      io::Printer::Print(printer,"case $tag$: {\n","tag",&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      io::Printer::Indent(printer);
      pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                         (&pIVar3->field_generators_,this_00);
      (*pIVar7->_vptr_ImmutableFieldLiteGenerator[0xb])(pIVar7,printer);
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"  break;\n}\n");
    }
  }
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  }\n}\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,
                     "} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n  throw new RuntimeException(e.setUnfinishedMessage(this));\n} catch (java.io.IOException e) {\n  throw new RuntimeException(\n      new com.google.protobuf.InvalidProtocolBufferException(\n          e.getMessage()).setUnfinishedMessage(this));\n} finally {\n"
                    );
  io::Printer::Indent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::~scoped_array(&local_60);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateDynamicMethodMergeFromStream(
    io::Printer* printer) {
  printer->Print(
      "com.google.protobuf.CodedInputStream input =\n"
      "    (com.google.protobuf.CodedInputStream) arg0;\n"
      "com.google.protobuf.ExtensionRegistryLite extensionRegistry =\n"
      "    (com.google.protobuf.ExtensionRegistryLite) arg1;\n");
  printer->Print(
      "try {\n");
  printer->Indent();
  printer->Print(
    "boolean done = false;\n"
    "while (!done) {\n");
  printer->Indent();

  printer->Print(
    "int tag = input.readTag();\n"
    "switch (tag) {\n");
  printer->Indent();

  printer->Print(
    "case 0:\n"          // zero signals EOF / limit reached
    "  done = true;\n"
    "  break;\n");

  if (PreserveUnknownFields(descriptor_)) {
    if (descriptor_->extension_range_count() > 0) {
      if (descriptor_->options().message_set_wire_format()) {
        printer->Print(
            "default: {\n"
            "  if (!parseUnknownFieldAsMessageSet(\n"
            "      getDefaultInstanceForType(), input, extensionRegistry,\n"
            "      tag)) {\n"
            "    done = true;\n"  // it's an endgroup tag
            "  }\n"
            "  break;\n"
            "}\n");
      } else {
        printer->Print(
            "default: {\n"
            "  if (!parseUnknownField(getDefaultInstanceForType(),\n"
            "      input, extensionRegistry, tag)) {\n"
            "    done = true;\n"  // it's an endgroup tag
            "  }\n"
            "  break;\n"
            "}\n");
      }
    } else {
      printer->Print(
        "default: {\n"
        "  if (!parseUnknownField(tag, input)) {\n"
        "    done = true;\n"  // it's an endgroup tag
        "  }\n"
        "  break;\n"
        "}\n");
    }
  } else {
    printer->Print(
      "default: {\n"
      "  if (!input.skipField(tag)) {\n"
      "    done = true;\n"  // it's an endgroup tag
      "  }\n"
      "  break;\n"
      "}\n");
  }

  google::protobuf::scoped_array<const FieldDescriptor * > sorted_fields(
      SortFieldsByNumber(descriptor_));
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = sorted_fields[i];
    uint32 tag = WireFormatLite::MakeTag(field->number(),
      WireFormat::WireTypeForFieldType(field->type()));

    printer->Print(
      "case $tag$: {\n",
      "tag", SimpleItoa(static_cast<int32>(tag)));
    printer->Indent();

    field_generators_.get(field).GenerateParsingCode(printer);

    printer->Outdent();
    printer->Print(
      "  break;\n"
      "}\n");

    if (field->is_packable()) {
      // To make packed = true wire compatible, we generate parsing code from a
      // packed version of this field regardless of field->options().packed().
      uint32 packed_tag = WireFormatLite::MakeTag(field->number(),
        WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
      printer->Print(
        "case $tag$: {\n",
        "tag", SimpleItoa(static_cast<int32>(packed_tag)));
      printer->Indent();

      field_generators_.get(field).GenerateParsingCodeFromPacked(printer);

      printer->Outdent();
      printer->Print(
        "  break;\n"
        "}\n");
    }
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
      "  }\n"     // switch (tag)
      "}\n");     // while (!done)

  printer->Outdent();
  printer->Print(
      "} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n"
      "  throw new RuntimeException(e.setUnfinishedMessage(this));\n"
      "} catch (java.io.IOException e) {\n"
      "  throw new RuntimeException(\n"
      "      new com.google.protobuf.InvalidProtocolBufferException(\n"
      "          e.getMessage()).setUnfinishedMessage(this));\n"
      "} finally {\n");
  printer->Indent();

  printer->Outdent();
  printer->Print(
      "}\n");     // finally
}